

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy.h
# Opt level: O1

int64_t __thiscall
disruptor::YieldingStrategy<200l>::WaitFor<long,std::ratio<1l,1000000l>>
          (YieldingStrategy<200l> *this,int64_t *sequence,Sequence *cursor,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          atomic<bool> *alerted,duration<long,_std::ratio<1L,_1000000L>_> *timeout)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  long lVar5;
  bool bVar6;
  function<long_()> min_sequence;
  Sequence *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  lVar1 = timeout->__r;
  bVar6 = (dependents->
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>)._M_impl
          .super__Vector_impl_data._M_finish !=
          (dependents->
          super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>)._M_impl
          .super__Vector_impl_data._M_start;
  uStack_50 = 0;
  if (bVar6) {
    cursor = (Sequence *)dependents;
  }
  pcStack_40 = std::
               _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:383:12)>
               ::_M_invoke;
  if (!bVar6) {
    pcStack_40 = std::
                 _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:381:12)>
                 ::_M_invoke;
  }
  local_48 = std::
             _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:383:12)>
             ::_M_manager;
  if (!bVar6) {
    local_48 = std::
               _Function_handler<long_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/disruptor/wait_strategy.h:381:12)>
               ::_M_manager;
  }
  lVar5 = 200;
  local_58 = cursor;
  while( true ) {
    if (local_48 == (code *)0x0) {
      uVar4 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar4);
    }
    lVar3 = (*pcStack_40)(&local_58);
    if (*sequence <= lVar3) goto LAB_00119856;
    if (((alerted->_M_base)._M_i & 1U) != 0) break;
    if (lVar5 == 0) {
      sched_yield();
      lVar5 = 0;
    }
    else {
      lVar5 = lVar5 + -1;
    }
    lVar3 = std::chrono::_V2::system_clock::now();
    if (lVar1 * 1000 + lVar2 <= lVar3) {
      lVar3 = -3;
LAB_00119856:
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,3);
      }
      return lVar3;
    }
  }
  lVar3 = -2;
  goto LAB_00119856;
}

Assistant:

int64_t WaitFor(const int64_t& sequence, const Sequence& cursor,
                  const std::vector<Sequence*>& dependents,
                  const std::atomic<bool>& alerted,
                  const std::chrono::duration<R, P>& timeout) {
    int64_t available_sequence = kInitialCursorValue;
    int64_t counter = S;

    const auto start = std::chrono::system_clock::now();
    const auto stop = start + timeout;
    const auto min_sequence = buildMinSequenceFunction(cursor, dependents);

    while ((available_sequence = min_sequence()) < sequence) {
      if (alerted.load()) return kAlertedSignal;

      counter = ApplyWaitMethod(counter);

      if (stop <= std::chrono::system_clock::now()) return kTimeoutSignal;
    }

    return available_sequence;
  }